

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ModuleDeclarationSyntax * __thiscall
slang::parsing::Parser::parseModule
          (Parser *this,AttrList attributes,SyntaxKind parentKind,bool *anyLocalModules)

{
  TokenKind TVar1;
  TokenKind TVar2;
  TokenKind kind;
  SyntaxKind kind_00;
  int iVar3;
  ModuleHeaderSyntax *pMVar4;
  sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
  *this_00;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  ModuleDeclarationSyntax *pMVar5;
  Node *pNVar6;
  bool bVar7;
  bool bVar8;
  Token TVar9;
  bool anyLocalModules_1;
  _Storage<slang::TimeScale,_true> local_10c;
  bool local_108;
  SyntaxKind local_104;
  Preprocessor *local_100;
  pointer local_f8;
  pointer local_f0;
  char local_e8 [8];
  ModuleHeaderSyntax *local_e0;
  Token endmodule;
  string_view name;
  char local_a0 [8];
  pointer local_98;
  char local_90 [8];
  MemberSyntax *member;
  SyntaxNode *local_58;
  SyntaxKind local_50;
  pointer local_40;
  
  local_e8 = (char  [8])attributes.size_;
  local_f0 = attributes.data_;
  local_100 = (this->super_ParserBase).window.tokenSource;
  local_100->designElementDepth = local_100->designElementDepth + 1;
  pMVar4 = parseModuleHeader(this);
  kind = slang::syntax::SyntaxFacts::getModuleEndKind((pMVar4->moduleKeyword).kind);
  if ((parentKind != CompilationUnit) && (name = Token::valueText(&pMVar4->name), name._M_len != 0))
  {
    if (*anyLocalModules == false) {
      SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::emplace_back<>(&(this->moduleDeclStack).
                        super_SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      );
      *anyLocalModules = true;
    }
    this_00 = (sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
               *)SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 ::back(&(this->moduleDeclStack).
                         super_SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       );
    ska::detailv3::
    sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
    ::emplace<std::basic_string_view<char,std::char_traits<char>>&>(this_00,&name);
  }
  local_e0 = pMVar4;
  kind_00 = slang::syntax::SyntaxFacts::getModuleDeclarationKind((pMVar4->moduleKeyword).kind);
  TVar1 = local_100->defaultNetType;
  TVar2 = local_100->unconnectedDrive;
  local_108 = (local_100->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::TimeScale>._M_engaged;
  local_10c = (local_100->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::TimeScale>._M_payload;
  local_104 = this->currentDefinitionKind;
  this->currentDefinitionKind = kind_00;
  Token::Token(&endmodule);
  name._M_str = (char *)0x0;
  name._M_len = (size_t)local_a0;
  anyLocalModules_1 = false;
  bVar7 = false;
  while( true ) {
    TVar9 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar9.kind == EndOfFile) || (kind == TVar9.kind)) break;
    member = parseMember(this,kind_00,&anyLocalModules_1);
    bVar8 = member == (MemberSyntax *)0x0;
    if (bVar8) {
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)((byte)~bVar7 & 1) << 0x20 | 0x350005));
      bVar7 = bVar8;
    }
    else {
      checkMemberAllowed(this,&member->super_SyntaxNode,kind_00);
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&name,&member);
      bVar7 = bVar8;
    }
  }
  if (anyLocalModules_1 == true) {
    SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  endmodule = ParserBase::expect(&this->super_ParserBase,kind);
  iVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)&name,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)endmodule.info);
  local_f8 = (pointer)CONCAT44(extraout_var,iVar3);
  SmallVectorBase<slang::syntax::MemberSyntax_*>::~SmallVectorBase
            ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)&name);
  this->currentDefinitionKind = local_104;
  local_100->designElementDepth = local_100->designElementDepth + -1;
  endBlock = parseNamedBlockClause(this);
  pMVar4 = local_e0;
  TVar9.kind = (local_e0->name).kind;
  TVar9._2_1_ = (local_e0->name).field_0x2;
  TVar9.numFlags.raw = (local_e0->name).numFlags.raw;
  TVar9.rawLen = (local_e0->name).rawLen;
  TVar9.info = (local_e0->name).info;
  checkBlockNames(this,TVar9,endBlock);
  local_50 = SyntaxList;
  local_a0[0] = local_e8[0];
  local_a0[1] = local_e8[1];
  local_a0[2] = local_e8[2];
  local_a0[3] = local_e8[3];
  local_a0[4] = local_e8[4];
  local_a0[5] = local_e8[5];
  local_a0[6] = local_e8[6];
  local_a0[7] = local_e8[7];
  local_98 = local_f0;
  local_90[0] = local_e8[0];
  local_90[1] = local_e8[1];
  local_90[2] = local_e8[2];
  local_90[3] = local_e8[3];
  local_90[4] = local_e8[4];
  local_90[5] = local_e8[5];
  local_90[6] = local_e8[6];
  local_90[7] = local_e8[7];
  local_58 = (SyntaxNode *)0x0;
  name = (string_view)ZEXT816(0x4703a8);
  local_40 = local_f8;
  member = (MemberSyntax *)&PTR_getChild_00473020;
  pMVar5 = slang::syntax::SyntaxFactory::moduleDeclaration
                     (&this->factory,kind_00,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&name,pMVar4,
                      (SyntaxList<slang::syntax::MemberSyntax> *)&member,endmodule,endBlock);
  name._M_len = (size_t)pMVar5;
  pNVar6 = ska::
           flat_hash_map<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>
           ::operator[](&(this->meta).nodeMap,(SyntaxNode **)&name);
  pNVar6->defaultNetType = TVar1;
  pNVar6->unconnectedDrive = TVar2;
  (pNVar6->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_payload = local_10c;
  (pNVar6->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = local_108;
  return pMVar5;
}

Assistant:

ModuleDeclarationSyntax& Parser::parseModule(AttrList attributes, SyntaxKind parentKind,
                                             bool& anyLocalModules) {
    // Tell the preprocessor that we're inside a design element for the duration of this function.
    auto& pp = getPP();
    pp.pushDesignElementStack();

    auto& header = parseModuleHeader();
    auto endKind = getModuleEndKind(header.moduleKeyword.kind);

    // If the parent isn't a compilation unit, that means we're a nested definition.
    // Record our name in the decl stack so that child instantiations know they're
    // referencing a local module and not a global one.
    if (parentKind != SyntaxKind::CompilationUnit) {
        auto name = header.name.valueText();
        if (!name.empty()) {
            if (!anyLocalModules) {
                moduleDeclStack.emplace_back();
                anyLocalModules = true;
            }
            moduleDeclStack.back().emplace(name);
        }
    }

    SyntaxKind declKind = getModuleDeclarationKind(header.moduleKeyword.kind);
    ParserMetadata::Node node{pp.getDefaultNetType(), pp.getUnconnectedDrive(), pp.getTimeScale()};

    auto savedDefinitionKind = currentDefinitionKind;
    currentDefinitionKind = declKind;

    Token endmodule;
    auto members = parseMemberList<MemberSyntax>(
        endKind, endmodule, declKind, [this](SyntaxKind parentKind, bool& anyLocalModules) {
            return parseMember(parentKind, anyLocalModules);
        });

    currentDefinitionKind = savedDefinitionKind;
    pp.popDesignElementStack();

    auto endName = parseNamedBlockClause();
    checkBlockNames(header.name, endName);

    auto& result = factory.moduleDeclaration(declKind, attributes, header, members, endmodule,
                                             endName);

    meta.nodeMap[&result] = node;
    return result;
}